

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asymcipher.c
# Opt level: O0

void EVP_ASYM_CIPHER_free(EVP_ASYM_CIPHER *cipher)

{
  void *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  if ((in_RDI != (void *)0x0) &&
     (CRYPTO_DOWN_REF((int *)((long)in_RDI + 0x20),(int *)&stack0xfffffffffffffff4,
                      *(void **)((long)in_RDI + 0x28)), in_stack_fffffffffffffff4 < 1)) {
    CRYPTO_free(*(void **)((long)in_RDI + 8));
    ossl_provider_free((OSSL_PROVIDER *)
                       CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    CRYPTO_THREAD_lock_free((CRYPTO_RWLOCK *)0x4143fe);
    CRYPTO_free(in_RDI);
  }
  return;
}

Assistant:

void EVP_ASYM_CIPHER_free(EVP_ASYM_CIPHER *cipher)
{
    int i;

    if (cipher == NULL)
        return;
    CRYPTO_DOWN_REF(&cipher->refcnt, &i, cipher->lock);
    if (i > 0)
        return;
    OPENSSL_free(cipher->type_name);
    ossl_provider_free(cipher->prov);
    CRYPTO_THREAD_lock_free(cipher->lock);
    OPENSSL_free(cipher);
}